

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cpp
# Opt level: O1

void __thiscall
icu_63::CheckedArrayByteSink::Append(CheckedArrayByteSink *this,char *bytes,int32_t n)

{
  uint uVar1;
  
  if (0 < n) {
    if ((int)(this->appended_ ^ 0x7fffffffU) < n) {
      this->appended_ = 0x7fffffff;
      this->overflowed_ = '\x01';
    }
    else {
      this->appended_ = this->appended_ + n;
      uVar1 = this->capacity_ - this->size_;
      if ((int)uVar1 < n) {
        this->overflowed_ = '\x01';
        n = uVar1;
      }
      if ((0 < n) && (this->outbuf_ + this->size_ != bytes)) {
        memcpy(this->outbuf_ + this->size_,bytes,(ulong)(uint)n);
      }
      this->size_ = this->size_ + n;
    }
  }
  return;
}

Assistant:

void CheckedArrayByteSink::Append(const char* bytes, int32_t n) {
  if (n <= 0) {
    return;
  }
  if (n > (INT32_MAX - appended_)) {
    // TODO: Report as integer overflow, not merely buffer overflow.
    appended_ = INT32_MAX;
    overflowed_ = TRUE;
    return;
  }
  appended_ += n;
  int32_t available = capacity_ - size_;
  if (n > available) {
    n = available;
    overflowed_ = TRUE;
  }
  if (n > 0 && bytes != (outbuf_ + size_)) {
    uprv_memcpy(outbuf_ + size_, bytes, n);
  }
  size_ += n;
}